

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O0

void leaveblock(FuncState *fs)

{
  BlockCnt *bl_00;
  LexState *ls_00;
  byte bVar1;
  TString *name;
  lu_byte stklevel;
  LexState *ls;
  BlockCnt *bl;
  FuncState *fs_local;
  
  bl_00 = fs->bl;
  ls_00 = fs->ls;
  bVar1 = reglevel(fs,(uint)bl_00->nactvar);
  if ((bl_00->previous != (BlockCnt *)0x0) && (bl_00->upval != '\0')) {
    luaK_codeABCk(fs,OP_CLOSE,(uint)bVar1,0,0,0);
  }
  fs->freereg = bVar1;
  removevars(fs,(uint)bl_00->nactvar);
  if (bl_00->isloop == '\x02') {
    name = luaS_newlstr(ls_00->L,"break",5);
    createlabel(ls_00,name,0,0);
  }
  solvegotos(fs,bl_00);
  if ((bl_00->previous == (BlockCnt *)0x0) && (bl_00->firstgoto < (ls_00->dyd->gt).n)) {
    undefgoto(ls_00,(ls_00->dyd->gt).arr + bl_00->firstgoto);
  }
  fs->bl = bl_00->previous;
  return;
}

Assistant:

static void leaveblock (FuncState *fs) {
  BlockCnt *bl = fs->bl;
  LexState *ls = fs->ls;
  lu_byte stklevel = reglevel(fs, bl->nactvar);  /* level outside block */
  if (bl->previous && bl->upval)  /* need a 'close'? */
    luaK_codeABC(fs, OP_CLOSE, stklevel, 0, 0);
  fs->freereg = stklevel;  /* free registers */
  removevars(fs, bl->nactvar);  /* remove block locals */
  lua_assert(bl->nactvar == fs->nactvar);  /* back to level on entry */
  if (bl->isloop == 2)  /* has to fix pending breaks? */
    createlabel(ls, luaS_newliteral(ls->L, "break"), 0, 0);
  solvegotos(fs, bl);
  if (bl->previous == NULL) {  /* was it the last block? */
    if (bl->firstgoto < ls->dyd->gt.n)  /* still pending gotos? */
      undefgoto(ls, &ls->dyd->gt.arr[bl->firstgoto]);  /* error */
  }
  fs->bl = bl->previous;  /* current block now is previous one */
}